

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O3

int __thiscall Procedure::getAdr(Procedure *this,string *name,int *adr)

{
  long lVar1;
  pointer pDVar2;
  pointer __s2;
  size_t __n;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  bool bVar7;
  ulong uVar8;
  
  pDVar2 = (this->nameTable).super__Vector_base<Description,_std::allocator<Description>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->nameTable).super__Vector_base<Description,_std::allocator<Description>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pDVar2;
  if (lVar4 == 0) {
    bVar7 = true;
  }
  else {
    lVar4 = lVar4 >> 4;
    uVar5 = lVar4 * -0x5555555555555555;
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    bVar7 = false;
    piVar6 = &pDVar2->adr;
    uVar8 = 1;
    do {
      if ((*(size_t *)(piVar6 + -7) == __n) &&
         (((__n == 0 ||
           (iVar3 = bcmp((((Description *)(piVar6 + -9))->name)._M_dataplus._M_p,__s2,__n),
           iVar3 == 0)) && (piVar6[-1] == 1)))) {
        *adr = *piVar6;
        break;
      }
      bVar7 = uVar5 < uVar8 || uVar5 - uVar8 == 0;
      piVar6 = piVar6 + 0xc;
      lVar1 = (lVar4 * 0x5555555555555555 - (ulong)(uVar5 == 0)) + uVar8;
      uVar8 = uVar8 + 1;
    } while (lVar1 != 0);
  }
  return -(uint)bVar7;
}

Assistant:

int getAdr(const std::string &name, int &adr) {
		for (auto i = 0; i < nameTable.size(); i++) {
			if (nameTable[i].name == name) {
				if (nameTable[i].kind != 1) continue;
				adr = nameTable[i].adr;
				return 0;
			}
		}
		return -1;
	}